

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

Var __thiscall Minisat::SimpSolver::newVar(SimpSolver *this,lbool upol,bool dvar)

{
  Var v;
  int local_1c;
  
  local_1c = Solver::newVar(&this->super_Solver,upol,dvar);
  IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,local_1c,'\0');
  IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,local_1c,
             '\0');
  if (this->use_simplification == true) {
    IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>::insert
              (&(this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>,
               (Lit)(local_1c * 2),0);
    IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>::insert
              (&(this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>,
               (Lit)(local_1c * 2 + 1),0);
    OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
    ::init(&this->occurs,(EVP_PKEY_CTX *)&local_1c);
    IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::insert
              (&(this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,local_1c,'\0'
              );
    Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::insert
              (&this->elim_heap,local_1c);
  }
  return local_1c;
}

Assistant:

Var SimpSolver::newVar(lbool upol, bool dvar) {
    Var v = Solver::newVar(upol, dvar);

    frozen    .insert(v, (char)false);
    eliminated.insert(v, (char)false);

    if (use_simplification){
        n_occ     .insert( mkLit(v), 0);
        n_occ     .insert(~mkLit(v), 0);
        occurs    .init  (v);
        touched   .insert(v, 0);
        elim_heap .insert(v);
    }
    return v; }